

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticArray.hpp
# Opt level: O2

void __thiscall
cont::StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::StaticArray(StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *sa)

{
  ulong *puVar1;
  ulong *puVar2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  ulong uVar5;
  
  this->m_MasPoint = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  this->m_Size = 0;
  uVar5 = (ulong)sa->m_Size;
  this->m_Size = sa->m_Size;
  lVar3 = uVar5 * 0x20;
  puVar1 = (ulong *)operator_new__(lVar3 + 8);
  *puVar1 = uVar5;
  if (uVar5 != 0) {
    puVar2 = puVar1 + 3;
    do {
      puVar2[-2] = (ulong)puVar2;
      puVar2[-1] = 0;
      *(undefined1 *)puVar2 = 0;
      puVar2 = puVar2 + 4;
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != 0);
  }
  this->m_MasPoint =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + 1);
  lVar3 = 0;
  for (uVar4 = 0; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    std::__cxx11::string::_M_assign((string *)((long)&(this->m_MasPoint->_M_dataplus)._M_p + lVar3))
    ;
    uVar5 = (ulong)this->m_Size;
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

StaticArray<T>::StaticArray(const StaticArray& sa)
    {
        m_Size = sa.size();
        m_MasPoint = new T[m_Size];
        for (uint32_t i = 0; i < m_Size; i++)
            m_MasPoint[i] = sa[i];
    }